

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

NodePtr __thiscall dh::analysis::break_stmt(analysis *this)

{
  element_type *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar2;
  allocator local_81;
  string local_80 [36];
  int local_5c [6];
  allocator local_41;
  string local_40 [32];
  int local_20;
  undefined1 local_19;
  analysis *this_local;
  NodePtr *ret;
  
  local_19 = 0;
  this_local = this;
  this_00 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &in_RSI->tmp);
  local_20 = token::getLineno(this_00);
  std::make_shared<dh::TreeNode,char_const(&)[6],int>((char (*) [6])this,(int *)"break");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"break",&local_41);
  match(in_RSI,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  peVar1 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_5c[1] = 4;
  TreeNode::setNodeKind(peVar1,local_5c + 1);
  peVar1 = std::__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  local_5c[0] = 4;
  TreeNode::setKind(peVar1,local_5c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,";",&local_81);
  match(in_RSI,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::break_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in break_stmt\n";
#endif

	NodePtr ret = ::std::make_shared<TreeNode>("break",tmp->getLineno());
	match("break");
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::BreakK);
	match(";");

	return ret;
}